

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseFilters::~TestCaseFilters(TestCaseFilters *this)

{
  long in_RDI;
  vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)unaff_retaddr)
  ;
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)unaff_retaddr)
  ;
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}